

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.c
# Opt level: O0

int nni_ctx_find(nni_ctx **cp,uint32_t id)

{
  nni_ctx *pnVar1;
  nni_ctx *ctx;
  int rv;
  uint32_t id_local;
  nni_ctx **cp_local;
  
  ctx._0_4_ = 0;
  nni_mtx_lock(&sock_lk);
  pnVar1 = (nni_ctx *)nni_id_get(&ctx_ids,(ulong)id);
  if (pnVar1 == (nni_ctx *)0x0) {
    ctx._0_4_ = 7;
  }
  else if (((pnVar1->c_closed & 1U) == 0) && ((pnVar1->c_sock->s_closed & 1U) == 0)) {
    pnVar1->c_ref = pnVar1->c_ref + 1;
    *cp = pnVar1;
  }
  else {
    ctx._0_4_ = 7;
  }
  nni_mtx_unlock(&sock_lk);
  return (int)ctx;
}

Assistant:

int
nni_ctx_find(nni_ctx **cp, uint32_t id)
{
	int      rv = 0;
	nni_ctx *ctx;

	nni_mtx_lock(&sock_lk);
	if ((ctx = nni_id_get(&ctx_ids, id)) != NULL) {
		// We refuse a reference if either the socket is
		// closed, or the context is closed.  (If the socket
		// is closed, and we are only getting the reference so
		// we can close it, then we still allow.  In the case
		// the only valid operation will be to close the
		// socket.)
		if (ctx->c_closed || ctx->c_sock->s_closed) {
			rv = NNG_ECLOSED;
		} else {
			ctx->c_ref++;
			*cp = ctx;
		}
	} else {
		rv = NNG_ECLOSED;
	}
	nni_mtx_unlock(&sock_lk);

	return (rv);
}